

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeNext(BtCursor *pCur)

{
  uint uVar1;
  MemPage *pMVar2;
  int iVar3;
  ushort uVar4;
  undefined8 in_RSI;
  
  if (pCur->eState != 0) {
    iVar3 = 0;
    if (2 < pCur->eState) {
      iVar3 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar3 != 0) {
      return iVar3;
    }
    if (pCur->eState == '\x01') {
      return 0x65;
    }
    if ((pCur->eState == '\x02') && (pCur->eState = '\0', 0 < pCur->skipNext)) {
      return 0;
    }
  }
  pMVar2 = pCur->pPage;
  uVar4 = pCur->ix + 1;
  pCur->ix = uVar4;
  if ((pMVar2->isInit == '\0') ||
     ((sqlite3Config.xTestCallback != (_func_int_int *)0x0 &&
      (iVar3 = (*sqlite3Config.xTestCallback)(0x19c), iVar3 != 0)))) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11cf1,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    return 0xb;
  }
  if (uVar4 < pMVar2->nCell) {
    if (pMVar2->leaf == '\0') {
LAB_0014753e:
      iVar3 = moveToLeftmost(pCur);
      return iVar3;
    }
  }
  else {
    if (pMVar2->leaf == '\0') {
      uVar1 = *(uint *)(pMVar2->aData + (ulong)pMVar2->hdrOffset + 8);
      iVar3 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18);
      if (iVar3 != 0) {
        return iVar3;
      }
      goto LAB_0014753e;
    }
    do {
      if (pCur->iPage == '\0') {
        pCur->eState = '\x01';
        return 0x65;
      }
      moveToParent(pCur);
    } while (pCur->pPage->nCell <= pCur->ix);
    if (pCur->pPage->intKey != '\0') {
      iVar3 = sqlite3BtreeNext(pCur,(int)in_RSI);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->eState==CURSOR_SKIPNEXT ){
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ) return SQLITE_OK;
    }
  }

  pPage = pCur->pPage;
  idx = ++pCur->ix;
  if( !pPage->isInit || sqlite3FaultSim(412) ){
    /* The only known way for this to happen is for there to be a
    ** recursive SQL function that does a DELETE operation as part of a
    ** SELECT which deletes content out from under an active cursor
    ** in a corrupt database file where the table being DELETE-ed from
    ** has pages in common with the table being queried.  See TH3
    ** module cov1/btree78.test testcase 220 (2018-06-08) for an
    ** example. */
    return SQLITE_CORRUPT_BKPT;
  }

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
      pPage = pCur->pPage;
    }while( pCur->ix>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, 0);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}